

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a4030 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a4037 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001a4020 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a4028 = 0x2d2d2d2d2d2d2d;
    DAT_001a402f = 0x2d;
    _DAT_001a4010 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a4018 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001a4000 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a4008 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a3ff8 = 0x2d2d2d2d2d2d2d2d;
    DAT_001a403f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}